

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_edit.h
# Opt level: O0

void __thiscall
leveldb::VersionEdit::SetCompactPointer(VersionEdit *this,int level,InternalKey *key)

{
  long lVar1;
  long in_FS_OFFSET;
  pair<int,_leveldb::InternalKey> *in_stack_ffffffffffffff88;
  int *in_stack_ffffffffffffff90;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::make_pair<int&,leveldb::InternalKey_const&>
            (in_stack_ffffffffffffff90,(InternalKey *)in_stack_ffffffffffffff88);
  std::
  vector<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
  ::push_back((vector<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
               *)in_stack_ffffffffffffff88,(value_type *)0xd3879a);
  std::pair<int,_leveldb::InternalKey>::~pair(in_stack_ffffffffffffff88);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SetCompactPointer(int level, const InternalKey& key) {
    compact_pointers_.push_back(std::make_pair(level, key));
  }